

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

Value __thiscall
xmrig::CpuBackendPrivate::hugePages(CpuBackendPrivate *this,int version,Document *doc)

{
  uint value;
  uint value_00;
  long in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  Value VVar2;
  
  std::mutex::lock((mutex *)mutex);
  value = *(uint *)(CONCAT44(in_register_00000034,version) + 0x10);
  value_00 = *(uint *)(CONCAT44(in_register_00000034,version) + 0x20);
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if ((int)doc < 2) {
    *(undefined8 *)((long)&this->controller + 6) = 0;
    this->controller = (Controller *)0x0;
    *(ushort *)((long)&(this->status).m_errors + 6) = (value == value_00) + 9;
    uVar1 = extraout_RDX;
  }
  else {
    this->controller = (Controller *)0x0;
    (this->status).m_errors = 0;
    *(undefined2 *)((long)&(this->status).m_errors + 6) = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,value,*(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RCX + 0x10));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,value_00,*(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RCX + 0x10));
    uVar1 = extraout_RDX_00;
  }
  VVar2.data_.s.str = (Ch *)uVar1;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value hugePages(int version, rapidjson::Document &doc)
    {
        std::pair<unsigned, unsigned> pages(0, 0);

        mutex.lock();

        pages.first  += status.hugePages();
        pages.second += status.pages();

        mutex.unlock();

        rapidjson::Value hugepages;

        if (version > 1) {
            hugepages.SetArray();
            hugepages.PushBack(pages.first, doc.GetAllocator());
            hugepages.PushBack(pages.second, doc.GetAllocator());
        }
        else {
            hugepages = pages.first == pages.second;
        }

        return hugepages;
    }